

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

MetadataResult ChangeDirectory(ShellState *state,char **azArg,idx_t nArg)

{
  int iVar1;
  long in_RSI;
  int rc;
  MetadataResult local_1;
  
  if (safe_mode) {
    fprintf(_stderr,".cd cannot be used in -safe mode\n");
    local_1 = FAIL;
  }
  else {
    iVar1 = chdir(*(char **)(in_RSI + 8));
    if (iVar1 == 0) {
      local_1 = SUCCESS;
    }
    else {
      fprintf(_stderr,"Cannot change to directory \"%s\"\n",*(undefined8 *)(in_RSI + 8));
      local_1 = FAIL;
    }
  }
  return local_1;
}

Assistant:

MetadataResult ChangeDirectory(ShellState &state, const char **azArg, idx_t nArg) {
	if (safe_mode) {
		utf8_printf(stderr, ".cd cannot be used in -safe mode\n");
		return MetadataResult::FAIL;
	}
	int rc;
#if defined(_WIN32) || defined(WIN32)
	wchar_t *z = sqlite3_win32_utf8_to_unicode(azArg[1]);
	rc = !SetCurrentDirectoryW(z);
	sqlite3_free(z);
#else
	rc = chdir(azArg[1]);
#endif
	if (rc) {
		utf8_printf(stderr, "Cannot change to directory \"%s\"\n", azArg[1]);
		return MetadataResult::FAIL;
	}
	return MetadataResult::SUCCESS;
}